

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_cond_move(DisasContext_conflict6 *ctx,uint32_t opc,int rd,int rs,int rt)

{
  TCGContext_conflict6 *tcg_ctx;
  TCGv_i64 t;
  TCGv_i64 c2;
  TCGv_i64 t_00;
  TCGv_i64 ret;
  TCGCond cond;
  TCGv_i64 pTVar1;
  
  if (rd == 0) {
    return;
  }
  tcg_ctx = ctx->uc->tcg_ctx;
  t = tcg_temp_new_i64(tcg_ctx);
  gen_load_gpr(tcg_ctx,t,rt);
  c2 = tcg_const_i64_mips64el(tcg_ctx,0);
  t_00 = tcg_temp_new_i64(tcg_ctx);
  gen_load_gpr(tcg_ctx,t_00,rs);
  if (opc == 10) {
    ret = tcg_ctx->cpu_gpr[(uint)rd];
    pTVar1 = ret;
LAB_0087809f:
    cond = TCG_COND_EQ;
  }
  else {
    pTVar1 = c2;
    if (opc == 0x37) {
      ret = tcg_ctx->cpu_gpr[(uint)rd];
      cond = TCG_COND_NE;
    }
    else {
      if (opc == 0x35) {
        ret = tcg_ctx->cpu_gpr[(uint)rd];
        goto LAB_0087809f;
      }
      if (opc != 0xb) goto LAB_008780b8;
      ret = tcg_ctx->cpu_gpr[(uint)rd];
      cond = TCG_COND_NE;
      pTVar1 = ret;
    }
  }
  tcg_gen_movcond_i64_mips64el(tcg_ctx,cond,ret,t,c2,t_00,pTVar1);
LAB_008780b8:
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t_00 + (long)tcg_ctx));
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(c2 + (long)tcg_ctx));
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_cond_move(DisasContext *ctx, uint32_t opc,
                          int rd, int rs, int rt)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0, t1, t2;

    if (rd == 0) {
        /* If no destination, treat it as a NOP. */
        return;
    }

    t0 = tcg_temp_new(tcg_ctx);
    gen_load_gpr(tcg_ctx, t0, rt);
    t1 = tcg_const_tl(tcg_ctx, 0);
    t2 = tcg_temp_new(tcg_ctx);
    gen_load_gpr(tcg_ctx, t2, rs);
    switch (opc) {
    case OPC_MOVN:
        tcg_gen_movcond_tl(tcg_ctx, TCG_COND_NE, tcg_ctx->cpu_gpr[rd], t0, t1, t2, tcg_ctx->cpu_gpr[rd]);
        break;
    case OPC_MOVZ:
        tcg_gen_movcond_tl(tcg_ctx, TCG_COND_EQ, tcg_ctx->cpu_gpr[rd], t0, t1, t2, tcg_ctx->cpu_gpr[rd]);
        break;
    case OPC_SELNEZ:
        tcg_gen_movcond_tl(tcg_ctx, TCG_COND_NE, tcg_ctx->cpu_gpr[rd], t0, t1, t2, t1);
        break;
    case OPC_SELEQZ:
        tcg_gen_movcond_tl(tcg_ctx, TCG_COND_EQ, tcg_ctx->cpu_gpr[rd], t0, t1, t2, t1);
        break;
    }
    tcg_temp_free(tcg_ctx, t2);
    tcg_temp_free(tcg_ctx, t1);
    tcg_temp_free(tcg_ctx, t0);
}